

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O1

MemberDeclarationSymbol * __thiscall
psy::C::TagDeclarationSymbol::member(TagDeclarationSymbol *this,Identifier *name)

{
  Symbol *this_00;
  SymbolKind SVar1;
  bool bVar2;
  TypeKind TVar3;
  int iVar4;
  Identifier *pIVar5;
  undefined4 extraout_var;
  Type *pTVar6;
  ostream *poVar7;
  undefined4 extraout_var_00;
  TagDeclarationSymbol *this_01;
  MemberDeclarationSymbol *pMVar8;
  MemberDeclarationSymbol *pMVar9;
  MemberDeclarationSymbol *pMVar10;
  long lVar11;
  MemberDeclarationSymbol *pMVar12;
  char cVar13;
  
  pMVar10 = (MemberDeclarationSymbol *)
            (this->membDecls_).
            super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar9 = (MemberDeclarationSymbol *)
           (this->membDecls_).
           super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pMVar9 - (long)pMVar10 >> 5;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    pMVar10 = (MemberDeclarationSymbol *)&pMVar10->super_MIXIN_NameableDeclarationSymbol;
    do {
      pMVar12 = pMVar10;
      pIVar5 = (Identifier *)
               (**(code **)(*pMVar12[-1].super_MIXIN_NameableDeclarationSymbol.
                             _vptr_MIXIN_NameableDeclarationSymbol + 0x128))();
      if (pIVar5 == name) {
        pMVar12 = (MemberDeclarationSymbol *)&pMVar12[-1].super_MIXIN_NameableDeclarationSymbol;
        goto LAB_002dd1db;
      }
      pIVar5 = (Identifier *)
               (**(code **)(*pMVar12[-1].super_MIXIN_TypeableDeclarationSymbol.
                             _vptr_MIXIN_TypeableDeclarationSymbol + 0x128))();
      if (pIVar5 == name) {
        pMVar12 = (MemberDeclarationSymbol *)&pMVar12[-1].super_MIXIN_TypeableDeclarationSymbol;
        goto LAB_002dd1db;
      }
      pIVar5 = (Identifier *)
               (**(code **)(*(pMVar12->super_DeclarationSymbol).super_Symbol._vptr_Symbol + 0x128))
                         ();
      if (pIVar5 == name) goto LAB_002dd1db;
      pIVar5 = (Identifier *)
               (*(code *)((pMVar12->super_DeclarationSymbol).super_Symbol.impl_._M_t.
                          super___uniq_ptr_impl<psy::C::Symbol::SymbolImpl,_std::default_delete<psy::C::Symbol::SymbolImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_psy::C::Symbol::SymbolImpl_*,_std::default_delete<psy::C::Symbol::SymbolImpl>_>
                          .super__Head_base<0UL,_psy::C::Symbol::SymbolImpl_*,_false>._M_head_impl)
                         ->containingSym_[0x12].impl_._M_t)();
      if (pIVar5 == name) {
        pMVar12 = (MemberDeclarationSymbol *)&(pMVar12->super_DeclarationSymbol).super_Symbol.impl_;
        goto LAB_002dd1db;
      }
      lVar11 = lVar11 + -1;
      pMVar10 = pMVar12 + 1;
    } while (1 < lVar11);
    pMVar10 = (MemberDeclarationSymbol *)&pMVar12->super_MIXIN_NameableDeclarationSymbol;
  }
  lVar11 = (long)pMVar9 - (long)pMVar10 >> 3;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      pMVar12 = pMVar9;
      if ((lVar11 != 3) ||
         (pIVar5 = (Identifier *)
                   (**(code **)(*(pMVar10->super_DeclarationSymbol).super_Symbol._vptr_Symbol +
                               0x128))(), pMVar12 = pMVar10, pIVar5 == name)) goto LAB_002dd1db;
      pMVar10 = (MemberDeclarationSymbol *)&(pMVar10->super_DeclarationSymbol).super_Symbol.impl_;
    }
    pIVar5 = (Identifier *)
             (**(code **)(*(pMVar10->super_DeclarationSymbol).super_Symbol._vptr_Symbol + 0x128))();
    pMVar12 = pMVar10;
    if (pIVar5 == name) goto LAB_002dd1db;
    pMVar10 = (MemberDeclarationSymbol *)&(pMVar10->super_DeclarationSymbol).super_Symbol.impl_;
  }
  pIVar5 = (Identifier *)
           (**(code **)(*(pMVar10->super_DeclarationSymbol).super_Symbol._vptr_Symbol + 0x128))();
  pMVar12 = pMVar10;
  if (pIVar5 != name) {
    pMVar12 = pMVar9;
  }
LAB_002dd1db:
  pMVar10 = (MemberDeclarationSymbol *)
            (this->membDecls_).
            super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar12 == pMVar10) {
    for (pMVar12 = (MemberDeclarationSymbol *)
                   (this->membDecls_).
                   super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar12 != pMVar10;
        pMVar12 = (MemberDeclarationSymbol *)&(pMVar12->super_DeclarationSymbol).super_Symbol.impl_)
    {
      this_00 = (Symbol *)(pMVar12->super_DeclarationSymbol).super_Symbol._vptr_Symbol;
      SVar1 = Symbol::kind(this_00);
      cVar13 = '\x03';
      if (SVar1 == FieldDeclaration) {
        iVar4 = (*this_00->_vptr_Symbol[0x15])(this_00);
        pMVar8 = (MemberDeclarationSymbol *)CONCAT44(extraout_var,iVar4);
        bVar2 = FieldDeclarationSymbol::isAnonymousStructureOrUnion
                          ((FieldDeclarationSymbol *)pMVar8);
        if (bVar2) {
          pTVar6 = MemberDeclarationSymbol::type(pMVar8);
          TVar3 = Type::kind(pTVar6);
          if (TVar3 != Tag) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                       ,0x65);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x61);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<empty message>",0xf);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          pTVar6 = MemberDeclarationSymbol::type(pMVar8);
          iVar4 = (*pTVar6->_vptr_Type[0xd])(pTVar6);
          this_01 = TagType::declaration((TagType *)CONCAT44(extraout_var_00,iVar4));
          if (this_01 != (TagDeclarationSymbol *)0x0) {
            pMVar8 = member(this_01,name);
            cVar13 = pMVar8 != (MemberDeclarationSymbol *)0x0;
            if ((bool)cVar13) {
              pMVar9 = pMVar8;
            }
          }
        }
        else {
          cVar13 = '\0';
        }
      }
      if ((cVar13 != '\x03') && (cVar13 != '\0')) {
        return pMVar9;
      }
    }
    pMVar10 = (MemberDeclarationSymbol *)0x0;
  }
  else {
    pMVar10 = (MemberDeclarationSymbol *)
              (pMVar12->super_DeclarationSymbol).super_Symbol._vptr_Symbol;
  }
  return pMVar10;
}

Assistant:

const MemberDeclarationSymbol* TagDeclarationSymbol::member(const Identifier* name) const
{
    auto it = std::find_if(membDecls_.begin(),
                           membDecls_.end(),
                           [name] (const MemberDeclarationSymbol* membDecl) {
                                return membDecl->name() == name;
                           });
    if (it != membDecls_.end())
        return *it;

    for (const auto membDecl : membDecls_) {
        if (membDecl->kind() != SymbolKind::FieldDeclaration)
            continue;
        auto fldDecl = membDecl->asFieldDeclaration();
        if (fldDecl->isAnonymousStructureOrUnion()) {
            PSY_ASSERT_2(fldDecl->type()->kind() == TypeKind::Tag, continue);
            auto tagTyDecl = fldDecl->type()->asTagType()->declaration();
            if (!tagTyDecl)
                continue;
            auto innerMembDecl = tagTyDecl->member(name);
            if (innerMembDecl)
                return innerMembDecl;
        }
    }
    return nullptr;
}